

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporaryfile.cpp
# Opt level: O1

int __thiscall QTemporaryFileEngine::open(QTemporaryFileEngine *this,char *__file,int __oflag,...)

{
  byte *pbVar1;
  uint uVar2;
  QAbstractFileEnginePrivate *pQVar3;
  Data *pDVar4;
  QArrayData *data;
  QAbstractFileEngine *pQVar5;
  QArrayData *pQVar6;
  char16_t *pcVar7;
  uint uVar8;
  int iVar9;
  qsizetype qVar10;
  int *piVar11;
  ulong unaff_RBX;
  char *pcVar12;
  int iVar13;
  FileError FVar14;
  QString *templateName;
  QTemporaryFileName *this_00;
  ulong unaff_R13;
  long in_FS_OFFSET;
  int local_c0;
  ErrorScope local_bc;
  QTemporaryFileName local_a8;
  QFileSystemEntry local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  FVar14 = (FileError)__file | FatalError;
  if (this->filePathIsTemplate == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      iVar13 = QFSFileEngine::open(&this->super_QFSFileEngine,(char *)(ulong)FVar14,__oflag);
      return iVar13;
    }
    goto LAB_0025b712;
  }
  pQVar3 = (this->super_QFSFileEngine).super_QAbstractFileEngine.d_ptr.d;
  this_00 = &local_a8;
  local_a8.path.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.path.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_a8.path.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.pos = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.length = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  templateName = this->templateName;
  QTemporaryFileName::QTemporaryFileName(this_00,templateName);
  uVar2 = this->fileMode;
  if (qt_haveLinuxProcfs()::present == '\0') {
    open((char *)this_00,(int)templateName);
  }
  iVar13 = 1;
  local_bc = NoError;
  if (qt_haveLinuxProcfs()::present == '\x01') {
    qVar10 = QByteArray::lastIndexOf(&local_a8.path,'/',-1);
    if (qVar10 < 0) {
      pcVar12 = ".";
    }
    else {
      qVar10 = qVar10 + (ulong)(qVar10 == 0);
      if ((&(local_a8.path.d.d)->super_QArrayData == (QArrayData *)0x0) ||
         (1 < ((local_a8.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i))
      {
        QByteArray::reallocData(&local_a8.path,local_a8.path.d.size,KeepSize);
      }
      local_a8.path.d.ptr[qVar10] = '\0';
      if ((&(local_a8.path.d.d)->super_QArrayData == (QArrayData *)0x0) ||
         (pcVar12 = local_a8.path.d.ptr,
         1 < ((local_a8.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QByteArray::reallocData(&local_a8.path,local_a8.path.d.size,KeepSize);
        pcVar12 = local_a8.path.d.ptr;
      }
    }
    do {
      uVar8 = open64(pcVar12,0x490002,(ulong)uVar2);
      unaff_RBX = (ulong)uVar8;
      if (uVar8 != 0xffffffff) {
        *(uint *)&pQVar3[3].q_ptr = uVar8;
        local_bc = NoError;
        local_c0 = 0;
        iVar13 = 0;
        goto LAB_0025b3f0;
      }
      piVar11 = __errno_location();
    } while (*piVar11 == 4);
    *(undefined4 *)&pQVar3[3].q_ptr = 0xffffffff;
    local_c0 = *piVar11;
    if (local_c0 != 0x5f) {
      local_bc = NativeError;
      iVar13 = 2;
      if (local_c0 != 0x15) goto LAB_0025b3f0;
    }
    local_bc = NoError;
    if (qVar10 != -1) {
      if ((&(local_a8.path.d.d)->super_QArrayData == (QArrayData *)0x0) ||
         (1 < ((local_a8.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i))
      {
        QByteArray::reallocData(&local_a8.path,local_a8.path.d.size,KeepSize);
      }
      local_a8.path.d.ptr[qVar10] = '/';
    }
    local_c0 = 0;
    iVar13 = 1;
  }
  else {
    local_c0 = 0;
  }
LAB_0025b3f0:
  if (iVar13 == 1) {
    uVar2 = this->fileMode;
    iVar13 = 0;
    do {
      QTemporaryFileName::generateNext((NativePath *)&local_78,&local_a8);
      pcVar12 = (char *)local_78.m_filePath.d.ptr;
      if (local_78.m_filePath.d.ptr == (char16_t *)0x0) {
        pcVar12 = "";
      }
      do {
        iVar9 = open64(pcVar12,0x800c2,(ulong)uVar2);
        if (iVar9 != -1) {
          *(int *)&pQVar3[3].q_ptr = iVar9;
          unaff_R13 = 1;
          unaff_RBX = 0;
          goto LAB_0025b4b7;
        }
        piVar11 = __errno_location();
      } while (*piVar11 == 4);
      *(undefined4 *)&pQVar3[3].q_ptr = 0xffffffff;
      iVar9 = *piVar11;
      unaff_RBX = CONCAT71((int7)((ulong)pcVar12 >> 8),iVar9 == 0x11);
      if (iVar9 != 0x11) {
        local_bc = NativeError;
        unaff_RBX = 0;
        unaff_R13 = 0;
        local_c0 = iVar9;
      }
LAB_0025b4b7:
      if (&(local_78.m_filePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_78.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          QArrayData::deallocate(&(local_78.m_filePath.d.d)->super_QArrayData,1,0x10);
        }
      }
      if ((char)unaff_RBX == '\0') {
        if ((unaff_R13 & 1) != 0) {
          this->filePathIsTemplate = false;
          this->unnamedFile = false;
          QFileSystemEntry::QFileSystemEntry(&local_78,&local_a8);
          pQVar6 = (QArrayData *)pQVar3[1]._vptr_QAbstractFileEnginePrivate;
          pcVar7 = *(char16_t **)&pQVar3[1].fileError;
          pQVar3[1]._vptr_QAbstractFileEnginePrivate = (_func_int **)local_78.m_filePath.d.d;
          *(char16_t **)&pQVar3[1].fileError = local_78.m_filePath.d.ptr;
          pDVar4 = pQVar3[1].errorString.d.d;
          pQVar3[1].errorString.d.d = (Data *)local_78.m_filePath.d.size;
          data = (QArrayData *)pQVar3[1].errorString.d.ptr;
          pcVar12 = (char *)pQVar3[1].errorString.d.size;
          pQVar3[1].errorString.d.ptr = (char16_t *)local_78.m_nativeFilePath.d.d;
          pQVar3[1].errorString.d.size = (qsizetype)local_78.m_nativeFilePath.d.ptr;
          pQVar5 = pQVar3[1].q_ptr;
          pQVar3[1].q_ptr = (QAbstractFileEngine *)local_78.m_nativeFilePath.d.size;
          *(qint16 *)((long)&pQVar3[2]._vptr_QAbstractFileEnginePrivate + 4) =
               local_78.m_lastDotInFileName;
          *(undefined4 *)&pQVar3[2]._vptr_QAbstractFileEnginePrivate = local_78._48_4_;
          local_78.m_filePath.d.d = (Data *)pQVar6;
          local_78.m_filePath.d.ptr = pcVar7;
          local_78.m_filePath.d.size = (qsizetype)pDVar4;
          local_78.m_nativeFilePath.d.d = (Data *)data;
          local_78.m_nativeFilePath.d.ptr = pcVar12;
          local_78.m_nativeFilePath.d.size = (qsizetype)pQVar5;
          if (data != (QArrayData *)0x0) {
            LOCK();
            (data->ref_)._q_value.super___atomic_base<int>._M_i =
                 (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(data,1,0x10);
            }
          }
          if (&(local_78.m_filePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i = ((local_78.m_filePath.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_78.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                ._M_i == 0) {
              QArrayData::deallocate(&(local_78.m_filePath.d.d)->super_QArrayData,2,0x10);
            }
          }
          goto LAB_0025b410;
        }
        break;
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 != 0x10);
LAB_0025b5cb:
    QSystemError::string(&local_78.m_filePath,local_bc,local_c0);
    QAbstractFileEngine::setError((QAbstractFileEngine *)this,OpenError,&local_78.m_filePath);
    if (&(local_78.m_filePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_78.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_78.m_filePath.d.d)->super_QArrayData,2,0x10);
      }
    }
    iVar13 = 0;
  }
  else {
    if (iVar13 != 0) goto LAB_0025b5cb;
    this->unnamedFile = true;
    QFileSystemEntry::clear((QFileSystemEntry *)(pQVar3 + 1));
LAB_0025b410:
    pQVar3[2].fileError = FVar14;
    *(undefined2 *)&pQVar3[4]._vptr_QAbstractFileEnginePrivate = 0x100;
    pbVar1 = (byte *)((long)&pQVar3[4]._vptr_QAbstractFileEnginePrivate + 2);
    *pbVar1 = *pbVar1 & 0xfb;
    iVar13 = (int)CONCAT71((int7)(unaff_RBX >> 8),1);
  }
  if (&(local_a8.path.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.path.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar13;
  }
LAB_0025b712:
  __stack_chk_fail();
}

Assistant:

bool QTemporaryFileEngine::open(QIODevice::OpenMode openMode,
                                std::optional<QFile::Permissions> permissions)
{
    Q_D(QFSFileEngine);
    Q_ASSERT(!isReallyOpen());

    openMode |= QIODevice::ReadWrite;

    if (!filePathIsTemplate)
        return QFSFileEngine::open(openMode, permissions);

    QTemporaryFileName tfn(templateName);

    QSystemError error;
#if defined(Q_OS_WIN)
    NativeFileHandle &file = d->fileHandle;
#else // POSIX
    NativeFileHandle &file = d->fd;
#endif

    CreateUnnamedFileStatus st = createUnnamedFile(file, tfn, fileMode, &error);
    if (st == CreateUnnamedFileStatus::Success) {
        unnamedFile = true;
        d->fileEntry.clear();
    } else if (st == CreateUnnamedFileStatus::NotSupported &&
               createFileFromTemplate(file, tfn, fileMode, flags, error)) {
        filePathIsTemplate = false;
        unnamedFile = false;
        d->fileEntry = QFileSystemEntry(tfn.path, QFileSystemEntry::FromNativePath());
    } else {
        setError(QFile::OpenError, error.toString());
        return false;
    }

#if !defined(Q_OS_WIN)
    d->closeFileHandle = true;
#endif

    d->openMode = openMode;
    d->lastFlushFailed = false;
    d->tried_stat = 0;

    return true;
}